

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O0

int __thiscall HighsCliqueTable::unlink(HighsCliqueTable *this,char *__name)

{
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  vector<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_> *this_00;
  vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_> *this_01;
  int in_EDX;
  int __c;
  int __c_00;
  int __c_01;
  int iVar5;
  char *pcVar6;
  HighsInt cliquelen;
  vector<int,_std::allocator<int>_> *this_02;
  
  iVar5 = (int)__name;
  this_02 = &this->numcliquesvar;
  pcVar6 = (char *)(long)iVar5;
  pvVar2 = std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
           operator[](&this->cliqueentries,(size_type)pcVar6);
  pcVar6 = CliqueVar::index(pvVar2,pcVar6,__c);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](this_02,(long)(int)pcVar6);
  *pvVar3 = *pvVar3 + -1;
  pvVar4 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
           operator[](&this->cliques,(long)in_EDX);
  iVar1 = pvVar4->end;
  pvVar4 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
           operator[](&this->cliques,(long)in_EDX);
  if (iVar1 - pvVar4->start == 2) {
    this_00 = &this->invertedHashListSizeTwo;
    pcVar6 = (char *)(long)iVar5;
    pvVar2 = std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             ::operator[](&this->cliqueentries,(size_type)pcVar6);
    pcVar6 = CliqueVar::index(pvVar2,pcVar6,__c_00);
    std::vector<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>::operator[]
              (this_00,(long)(int)pcVar6);
    HighsHashTree<int,_void>::erase((HighsHashTree<int,_void> *)this,(int *)this_02);
    iVar1 = extraout_EAX;
  }
  else {
    this_01 = &this->invertedHashList;
    pcVar6 = (char *)(long)iVar5;
    pvVar2 = std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             ::operator[](&this->cliqueentries,(size_type)pcVar6);
    pcVar6 = CliqueVar::index(pvVar2,pcVar6,__c_01);
    std::vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>::operator[]
              (this_01,(long)(int)pcVar6);
    HighsHashTree<int,_int>::erase((HighsHashTree<int,_int> *)this,(int *)this_02);
    iVar1 = extraout_EAX_00;
  }
  return iVar1;
}

Assistant:

void HighsCliqueTable::unlink(HighsInt pos, HighsInt cliqueid) {
  assert(pos >= 0);
  --numcliquesvar[cliqueentries[pos].index()];

  HighsInt cliquelen = cliques[cliqueid].end - cliques[cliqueid].start;
  if (cliquelen == 2)
    invertedHashListSizeTwo[cliqueentries[pos].index()].erase(cliqueid);
  else
    invertedHashList[cliqueentries[pos].index()].erase(cliqueid);
}